

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkResizeVecArray(ARKVecResizeFn resize,void *resize_data,int count,N_Vector tmpl,N_Vector **v,
                     sunindextype lrw_diff,long *lrw,sunindextype liw_diff,long *liw)

{
  int iVar1;
  N_Vector *pp_Var2;
  ulong uVar3;
  
  if (*v != (N_Vector *)0x0) {
    if (resize == (ARKVecResizeFn)0x0) {
      N_VDestroyVectorArray(*v,count);
      *v = (N_Vector *)0x0;
      pp_Var2 = (N_Vector *)N_VCloneVectorArray(count,tmpl);
      *v = pp_Var2;
      if (pp_Var2 == (N_Vector *)0x0) {
        return 0;
      }
    }
    else if (0 < count) {
      uVar3 = 0;
      do {
        iVar1 = (*resize)((*v)[uVar3],tmpl,resize_data);
        if (iVar1 != 0) {
          return 0;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)count != uVar3);
    }
    *lrw = *lrw + lrw_diff * count;
    *liw = *liw + liw_diff * count;
  }
  return 1;
}

Assistant:

sunbooleantype arkResizeVecArray(ARKVecResizeFn resize, void* resize_data,
                                 int count, N_Vector tmpl, N_Vector** v,
                                 sunindextype lrw_diff, long int* lrw,
                                 sunindextype liw_diff, long int* liw)
{
  int i;

  if (*v != NULL)
  {
    if (resize == NULL)
    {
      N_VDestroyVectorArray(*v, count);
      *v = NULL;
      *v = N_VCloneVectorArray(count, tmpl);
      if (*v == NULL) { return (SUNFALSE); }
    }
    else
    {
      for (i = 0; i < count; i++)
      {
        if (resize((*v)[i], tmpl, resize_data)) { return (SUNFALSE); }
      }
    }
    *lrw += count * lrw_diff;
    *liw += count * liw_diff;
  }
  return (SUNTRUE);
}